

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_source_interpolation_with_magic_number.cc
# Opt level: O2

void __thiscall
sptk::InputSourceInterpolationWithMagicNumber::CalculateIncrement
          (InputSourceInterpolationWithMagicNumber *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  
  iVar4 = this->interpolation_period_;
  iVar5 = this->frame_period_;
  pdVar6 = (this->next_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (this->curr_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar8 = (this->increment_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar10 = 0;
  uVar9 = (ulong)(uint)this->data_length_;
  if (this->data_length_ < 1) {
    uVar9 = uVar10;
  }
  for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
    dVar1 = this->magic_number_;
    dVar2 = pdVar6[uVar10];
    dVar11 = 1.79769313486232e+308;
    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
      dVar3 = pdVar7[uVar10];
      dVar11 = 1.79769313486232e+308;
      if ((dVar1 != dVar3) || (NAN(dVar1) || NAN(dVar3))) {
        dVar11 = (dVar2 - dVar3) * ((double)iVar4 / (double)iVar5);
      }
    }
    pdVar8[uVar10] = dVar11;
  }
  return;
}

Assistant:

void InputSourceInterpolationWithMagicNumber::CalculateIncrement() {
  const double rate(static_cast<double>(interpolation_period_) / frame_period_);
  for (int i(0); i < data_length_; ++i) {
    if (magic_number_ == next_data_[i] || magic_number_ == curr_data_[i]) {
      increment_[i] = kCannotCalculateIncrements;
    } else {
      increment_[i] = rate * (next_data_[i] - curr_data_[i]);
    }
  }
}